

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void startElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  int local_24;
  int i;
  xmlChar **atts_local;
  xmlChar *name_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (noout == 0) {
    fprintf(_stdout,"SAX.startElement(%s",name);
    if (atts != (xmlChar **)0x0) {
      for (local_24 = 0; atts[local_24] != (xmlChar *)0x0; local_24 = local_24 + 2) {
        fprintf(_stdout,", %s=\'",atts[local_24]);
        if (atts[local_24 + 1] != (xmlChar *)0x0) {
          fprintf(_stdout,"%s\'",atts[local_24 + 1]);
        }
      }
    }
    fprintf(_stdout,")\n");
  }
  return;
}

Assistant:

static void
startElementDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, const xmlChar **atts)
{
    int i;

    callbacks++;
    if (noout)
	return;
    fprintf(stdout, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(stdout, ", %s='", atts[i++]);
	    if (atts[i] != NULL)
	        fprintf(stdout, "%s'", atts[i]);
	}
    }
    fprintf(stdout, ")\n");
}